

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
MDIOSimulationDataGenerator::CreateMdioC45Transaction
          (MDIOSimulationDataGenerator *this,MdioOpCode opCode,U8 phyAddress,MdioDevType devType,
          U16 regAddress,U16 data)

{
  bool isReadOperation;
  
  CreateStart(this,C45_START);
  CreateOpCode(this,C45_ADDRESS);
  CreatePhyAddress(this,phyAddress);
  CreateDevType(this,devType);
  isReadOperation = (opCode & ~C22_WRITE) == C22_READ;
  CreateTurnAround(this,isReadOperation);
  CreateData(this,regAddress);
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  CreateStart(this,C45_START);
  CreateOpCode(this,opCode);
  CreatePhyAddress(this,phyAddress);
  CreateDevType(this,devType);
  CreateTurnAround(this,isReadOperation);
  CreateData(this,data);
  return;
}

Assistant:

void MDIOSimulationDataGenerator::CreateMdioC45Transaction( MdioOpCode opCode, U8 phyAddress, MdioDevType devType, U16 regAddress,
                                                            U16 data )
{
    // A Clause 45 transaction consists of TWO packets.
    // The first frame contains a 16 bit register address, the second has the 16 bit data

    // First packet
    CreateStart( C45_START );
    CreateOpCode( C45_ADDRESS );
    CreatePhyAddress( phyAddress );
    CreateDevType( devType );
    CreateTurnAround( IsReadOperation( opCode ) );
    CreateAddressOrData( regAddress );

    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 1 periods of idle

    // Second packet
    CreateStart( C45_START );
    CreateOpCode( opCode );
    CreatePhyAddress( phyAddress );
    CreateDevType( devType );
    CreateTurnAround( IsReadOperation( opCode ) );
    CreateAddressOrData( data );
}